

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O0

PList * p_hash_table_values(PHashTable *table)

{
  uint local_2c;
  PHashTableNode *pPStack_28;
  puint i;
  PHashTableNode *node;
  PList *ret;
  PHashTable *table_local;
  
  node = (PHashTableNode *)0x0;
  if (table == (PHashTable *)0x0) {
    table_local = (PHashTable *)0x0;
  }
  else {
    for (local_2c = 0; (ulong)local_2c < table->size; local_2c = local_2c + 1) {
      for (pPStack_28 = table->table[local_2c]; pPStack_28 != (PHashTableNode *)0x0;
          pPStack_28 = pPStack_28->next) {
        node = (PHashTableNode *)p_list_append((PList *)node,pPStack_28->value);
      }
    }
    table_local = (PHashTable *)node;
  }
  return (PList *)table_local;
}

Assistant:

P_LIB_API PList *
p_hash_table_values (const PHashTable *table)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next)
			ret = p_list_append (ret, node->value);

	return ret;
}